

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O3

bool __thiscall
duckdb::DictionaryAnalyzeState::CalculateSpaceRequirements
          (DictionaryAnalyzeState *this,bool new_string,idx_t string_size)

{
  idx_t iVar1;
  BlockManager *pBVar2;
  idx_t iVar3;
  idx_t iVar4;
  long lVar5;
  unsigned_long value;
  idx_t iVar6;
  idx_t iVar7;
  unsigned_long uVar8;
  byte bVar9;
  byte bVar10;
  undefined3 in_register_00000031;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  
  if (CONCAT31(in_register_00000031,new_string) == 0) {
    pBVar2 = (this->super_DictionaryCompressionState).super_CompressionState.info.block_manager;
    iVar1 = this->current_tuple_count;
    uVar11 = iVar1 + 1;
    iVar3 = this->current_unique_count;
    iVar4 = this->current_dict_size;
    bVar9 = this->current_width;
    iVar6 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
    iVar7 = optional_idx::GetIndex(&pBVar2->block_header_size);
    if ((uVar11 & 0x1f) != 0) {
      uVar8 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar11 & 0x1f);
      uVar11 = (iVar1 - uVar8) + 0x21;
    }
    uVar11 = iVar4 + iVar3 * 4 + (uVar11 * bVar9 >> 3) + 0x14;
    bVar12 = uVar11 < iVar6 - iVar7;
    bVar13 = uVar11 == iVar6 - iVar7;
  }
  else {
    iVar1 = this->current_unique_count;
    uVar11 = iVar1 + 2;
    lVar5 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    bVar9 = 0x40;
    if (uVar11 >> 0x38 == 0) {
      bVar9 = 0x40 - ((byte)lVar5 ^ 0x3f);
    }
    bVar10 = 0;
    if (uVar11 != 0) {
      bVar10 = bVar9;
    }
    this->next_width = bVar10;
    pBVar2 = (this->super_DictionaryCompressionState).super_CompressionState.info.block_manager;
    iVar3 = this->current_tuple_count;
    uVar11 = iVar3 + 1;
    iVar4 = this->current_dict_size;
    iVar6 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
    iVar7 = optional_idx::GetIndex(&pBVar2->block_header_size);
    if ((uVar11 & 0x1f) != 0) {
      uVar8 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar11 & 0x1f);
      uVar11 = (iVar3 - uVar8) + 0x21;
    }
    uVar11 = (bVar10 * uVar11 >> 3) + string_size + iVar1 * 4 + iVar4 + 0x18;
    bVar12 = uVar11 < iVar6 - iVar7;
    bVar13 = uVar11 == iVar6 - iVar7;
  }
  return bVar12 || bVar13;
}

Assistant:

bool DictionaryAnalyzeState::CalculateSpaceRequirements(bool new_string, idx_t string_size) {
	if (!new_string) {
		return DictionaryCompression::HasEnoughSpace(current_tuple_count + 1, current_unique_count, current_dict_size,
		                                             current_width, info.GetBlockSize());
	}
	next_width = BitpackingPrimitives::MinimumBitWidth(current_unique_count + 2); // 1 for null, one for new string
	return DictionaryCompression::HasEnoughSpace(current_tuple_count + 1, current_unique_count + 1,
	                                             current_dict_size + string_size, next_width, info.GetBlockSize());
}